

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void DispatchAlphaToGreen_SSE2
               (uint8_t *alpha,int alpha_stride,int width,int height,uint32_t *dst,int dst_stride)

{
  byte *pbVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [15];
  byte bVar18;
  byte bVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint32_t *puVar31;
  int iVar32;
  byte *pbVar33;
  long lVar34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [12];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  int5 iVar44;
  undefined1 auVar45 [16];
  uint3 uVar46;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar38 [15];
  undefined1 auVar37 [14];
  undefined1 auVar41 [16];
  uint uVar43;
  undefined4 uVar47;
  undefined6 uVar48;
  ulong uVar49;
  
  auVar30 = _DAT_001a8fb0;
  auVar29 = _DAT_001a8fa0;
  iVar32 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar32 != height; iVar32 = iVar32 + 1) {
    puVar31 = dst;
    pbVar33 = alpha;
    for (lVar34 = 0; lVar34 < (int)(width & 0xfffffff0); lVar34 = lVar34 + 0x10) {
      pbVar1 = alpha + lVar34;
      bVar18 = pbVar1[4];
      bVar19 = pbVar1[0xb];
      auVar24[10] = 0;
      auVar24._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar24[0xb] = pbVar1[5];
      auVar25[9] = bVar18;
      auVar25._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar25._10_2_ = auVar24._10_2_;
      auVar26._9_3_ = auVar25._9_3_;
      auVar26._0_9_ = (unkuint9)0;
      auVar16._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar26._8_4_,pbVar1[3])) << 0x38,6);
      auVar16[0] = pbVar1[2];
      auVar16._11_5_ = 0;
      auVar15._1_12_ = SUB1612(auVar16 << 0x28,4);
      auVar15[0] = pbVar1[1];
      auVar15._13_3_ = 0;
      auVar51._1_14_ = SUB1614(auVar15 << 0x18,2);
      auVar51[0] = *pbVar1;
      auVar51[0xf] = 0;
      auVar51 = auVar51 << 8;
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar51._0_13_;
      auVar5[0xe] = pbVar1[3];
      auVar8[0xc] = 0;
      auVar8._0_12_ = auVar51._0_12_;
      auVar8._13_2_ = auVar5._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar51._0_11_;
      auVar10._12_3_ = auVar8._12_3_;
      auVar11[10] = pbVar1[2];
      auVar11._0_10_ = auVar51._0_10_;
      auVar11._11_4_ = auVar10._11_4_;
      auVar14[9] = 0;
      auVar14._0_9_ = auVar51._0_9_;
      auVar14._10_5_ = auVar11._10_5_;
      auVar17[8] = 0;
      auVar17._0_8_ = auVar51._0_8_;
      auVar17._9_6_ = auVar14._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar17._8_7_;
      auVar23._1_8_ = SUB158(auVar20 << 0x40,7);
      auVar23[0] = pbVar1[1];
      auVar23._9_6_ = 0;
      auVar28._10_5_ = 0;
      auVar28._0_10_ = SUB1510(auVar23 << 0x30,5);
      auVar27._1_12_ = SUB1512(auVar28 << 0x28,3);
      auVar27[0] = *pbVar1;
      auVar50._0_4_ = auVar27._0_4_ << 0x10;
      auVar50._8_4_ = auVar17._8_4_;
      auVar50._4_3_ = auVar8._12_3_;
      auVar50[7] = 0;
      auVar50._12_4_ = SUB154(auVar23 << 0x30,5) << 8;
      auVar51 = pshufhw(auVar50,auVar50,0xc4);
      auVar52._0_4_ = auVar51._0_4_;
      auVar52._8_4_ = auVar51._8_4_;
      auVar52._4_4_ = auVar51._12_4_;
      auVar52._12_4_ = auVar51._4_4_;
      auVar52 = auVar52 & auVar29;
      sVar2 = auVar52._0_2_;
      sVar3 = auVar52._2_2_;
      sVar4 = auVar52._4_2_;
      uVar46 = CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar52[4] - (0xff < sVar4),
                        CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar52[2] - (0xff < sVar3),
                                 (0 < sVar2) * (sVar2 < 0x100) * auVar52[0] - (0xff < sVar2)));
      sVar2 = auVar52._6_2_;
      uVar47 = CONCAT13((0 < sVar2) * (sVar2 < 0x100) * auVar52[6] - (0xff < sVar2),uVar46);
      sVar2 = auVar52._8_2_;
      sVar3 = auVar52._10_2_;
      uVar48 = CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar52[10] - (0xff < sVar3),
                        CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar52[8] - (0xff < sVar2),uVar47)
                       );
      sVar2 = auVar52._12_2_;
      sVar3 = auVar52._14_2_;
      uVar49 = CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar52[0xe] - (0xff < sVar3),
                        CONCAT16((0 < sVar2) * (sVar2 < 0x100) * auVar52[0xc] - (0xff < sVar2),
                                 uVar48));
      auVar6[8] = 0;
      auVar6._0_8_ = uVar49;
      auVar6[9] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      iVar44 = (uint5)CONCAT12(pbVar1[9],(ushort)pbVar1[8]) << 8;
      auVar7[9] = pbVar1[0xc];
      auVar7._0_9_ = (unkuint9)bVar19 << 0x38;
      auVar35._0_10_ = (unkuint10)pbVar1[0xd] << 0x30;
      auVar35[10] = pbVar1[0xe];
      auVar38._11_3_ = 0;
      auVar38._0_11_ = auVar35;
      auVar38[0xe] = pbVar1[0xf];
      auVar39._0_4_ = (uint)pbVar1[0xc] << 0x10;
      auVar39._4_3_ = auVar38._12_3_;
      auVar39[7] = 0;
      auVar39._8_3_ = auVar35._8_3_;
      auVar39[0xb] = 0;
      auVar39._12_3_ = (int3)(((uint7)pbVar1[0xd] << 0x30) >> 0x20);
      auVar39[0xf] = 0;
      auVar51 = pshuflw(auVar39,auVar39,0xc4);
      auVar40._0_4_ = auVar51._0_4_;
      auVar40._8_4_ = auVar51._8_4_;
      auVar40._4_4_ = auVar51._12_4_;
      auVar40._12_4_ = auVar51._4_4_;
      auVar51 = pshufhw(auVar40,auVar40,0xc6);
      auVar51 = auVar51 & auVar30;
      sVar2 = auVar51._14_2_;
      sVar3 = auVar51._0_2_;
      sVar4 = auVar51._2_2_;
      auVar36._0_10_ =
           CONCAT19((0 < sVar4) * (sVar4 < 0x100) * auVar51[2] - (0xff < sVar4),
                    CONCAT18((0 < sVar3) * (sVar3 < 0x100) * auVar51[0] - (0xff < sVar3),
                             (long)CONCAT81(auVar51._8_8_,
                                            (0 < sVar2) * (sVar2 < 0x100) * auVar51[0xe] -
                                            (0xff < sVar2)) << 0x38));
      sVar3 = auVar51._4_2_;
      auVar36[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar51[4] - (0xff < sVar3);
      sVar3 = auVar51._6_2_;
      auVar36[0xb] = (0 < sVar3) * (sVar3 < 0x100) * auVar51[6] - (0xff < sVar3);
      sVar3 = auVar51._8_2_;
      auVar37[0xc] = (0 < sVar3) * (sVar3 < 0x100) * auVar51[8] - (0xff < sVar3);
      auVar37._0_12_ = auVar36;
      sVar3 = auVar51._10_2_;
      auVar37[0xd] = (0 < sVar3) * (sVar3 < 0x100) * auVar51[10] - (0xff < sVar3);
      sVar3 = auVar51._12_2_;
      auVar41[0xe] = (0 < sVar3) * (sVar3 < 0x100) * auVar51[0xc] - (0xff < sVar3);
      auVar41._0_14_ = auVar37;
      auVar41[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar51[0xe] - (0xff < sVar2);
      auVar6._10_2_ = 0;
      auVar6._12_2_ = (short)(uVar49 >> 0x30);
      auVar9._8_2_ = (short)((uint6)uVar48 >> 0x20);
      auVar9._0_8_ = uVar49;
      auVar9._10_4_ = auVar6._10_4_;
      auVar21._6_8_ = 0;
      auVar21._0_6_ = auVar9._8_6_;
      auVar12._4_2_ = (short)((uint)uVar47 >> 0x10);
      auVar12._0_4_ = uVar47;
      auVar12._6_8_ = SUB148(auVar21 << 0x40,6);
      auVar53._0_4_ = uVar46 & 0xffff;
      auVar53._4_10_ = auVar12._4_10_;
      auVar53._14_2_ = 0;
      auVar7._10_2_ = 0;
      auVar7._12_2_ = (short)(((ulong)bVar19 << 0x38) >> 0x30);
      auVar22._6_8_ = 0;
      auVar22._0_6_ =
           (uint6)(CONCAT43(auVar7._10_4_,
                            CONCAT21((short)(CONCAT15(pbVar1[10],iVar44) >> 0x20),bVar19)) >> 8);
      uVar43 = (uint)iVar44;
      auVar13._4_2_ = (short)(CONCAT12(pbVar1[9],(ushort)pbVar1[8]) >> 8);
      auVar13._0_4_ = uVar43;
      auVar13._6_8_ = SUB148(auVar22 << 0x40,6);
      auVar45._0_4_ = uVar43 & 0xffff;
      auVar45._4_10_ = auVar13._4_10_;
      auVar45._14_2_ = 0;
      auVar42._2_2_ = 0;
      auVar42._0_2_ = (ushort)((unkuint10)auVar36._0_10_ >> 0x40);
      auVar42._4_2_ = auVar36._10_2_;
      auVar42._6_2_ = 0;
      auVar42._8_2_ = auVar37._12_2_;
      auVar42._10_2_ = 0;
      auVar42._12_2_ = auVar41._14_2_;
      auVar42._14_2_ = 0;
      *(undefined1 (*) [16])(dst + lVar34) = auVar53;
      *(undefined1 (*) [16])(dst + lVar34 + 4) =
           ZEXT616(CONCAT24(auVar24._10_2_,(uint)auVar26._8_2_));
      *(undefined1 (*) [16])(dst + lVar34 + 8) = auVar45;
      *(undefined1 (*) [16])(dst + lVar34 + 0xc) = auVar42;
      puVar31 = puVar31 + 0x10;
      pbVar33 = pbVar33 + 0x10;
    }
    for (; lVar34 < width; lVar34 = lVar34 + 1) {
      *puVar31 = (uint)*pbVar33 << 8;
      puVar31 = puVar31 + 1;
      pbVar33 = pbVar33 + 1;
    }
    alpha = alpha + alpha_stride;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

static void DispatchAlphaToGreen_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                                      int alpha_stride, int width, int height,
                                      uint32_t* WEBP_RESTRICT dst,
                                      int dst_stride) {
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const int limit = width & ~15;
  for (j = 0; j < height; ++j) {
    for (i = 0; i < limit; i += 16) {   // process 16 alpha bytes
      const __m128i a0 = _mm_loadu_si128((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(zero, a0);  // note the 'zero' first!
      const __m128i b1 = _mm_unpackhi_epi8(zero, a0);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i b2_lo = _mm_unpacklo_epi16(b1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      const __m128i b2_hi = _mm_unpackhi_epi16(b1, zero);
      _mm_storeu_si128((__m128i*)&dst[i +  0], a2_lo);
      _mm_storeu_si128((__m128i*)&dst[i +  4], a2_hi);
      _mm_storeu_si128((__m128i*)&dst[i +  8], b2_lo);
      _mm_storeu_si128((__m128i*)&dst[i + 12], b2_hi);
    }
    for (; i < width; ++i) dst[i] = alpha[i] << 8;
    alpha += alpha_stride;
    dst += dst_stride;
  }
}